

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_expand_path(mcu8str *praw)

{
  char *pcVar1;
  mcu8str_size_t mVar2;
  ulong uVar3;
  mcu8str *in_RDI;
  mcu8str *rhome;
  mcu8str_size_t newsize;
  mcu8str_size_t home_size;
  char *home;
  mcu8str res;
  mcu8str p;
  mcu8str *c_str;
  mcu8str *in_stack_ffffffffffffff80;
  undefined8 local_78;
  ulong local_70;
  mcu8str *local_68;
  undefined8 local_60;
  ulong local_58;
  mcu8str *local_38;
  undefined8 local_30;
  ulong local_28;
  char *local_20;
  uint local_18;
  
  c_str = in_RDI;
  mctools_impl_view_no_winnamespace(in_RDI);
  if (local_18 == 0) {
    mcu8str_create_empty();
  }
  else {
    local_28 = local_28 & 0xffffffff00000000;
    local_30 = 0;
    if ((((1 < local_18) && (*local_20 == '~')) && ((local_20[1] == '/' || (local_20[1] == '\\'))))
       && (pcVar1 = getenv("HOME"), pcVar1 != (char *)0x0)) {
      if (local_18 == 2) {
        mcu8str_create_from_cstr((char *)in_stack_ffffffffffffff80);
        mctools_pathseps_platform(in_RDI);
        return c_str;
      }
      mVar2 = mctools_strlen((char *)in_stack_ffffffffffffff80,(mcu8str_size_t)c_str);
      uVar3 = (mVar2 + local_18) - 1;
      if (((mVar2 + local_18 != mVar2 + local_18) || (uVar3 <= mVar2)) || (uVar3 <= local_18)) {
        mctools_impl_error((char *)0x104561);
      }
      mcu8str_create((mcu8str_size_t)in_stack_ffffffffffffff80);
      local_38 = local_68;
      local_30 = local_60;
      local_28 = local_58;
      mcu8str_append_cstr(in_stack_ffffffffffffff80,(char *)c_str);
      mcu8str_append_cstr(in_stack_ffffffffffffff80,(char *)c_str);
    }
    if ((int)local_30 == 0) {
      mcu8str_copy(in_RDI);
      local_30 = local_78;
      local_28 = local_70;
      local_38 = in_stack_ffffffffffffff80;
    }
    mctools_pathseps_platform(in_RDI);
    in_RDI->c_str = (char *)local_38;
    in_RDI->size = (int)local_30;
    in_RDI->buflen = local_30._4_4_;
    *(ulong *)&in_RDI->owns_memory = local_28;
  }
  return c_str;
}

Assistant:

mcu8str mctools_expand_path( const mcu8str* praw )
  {
    mcu8str p = mctools_impl_view_no_winnamespace(praw);
    if ( p.size == 0 )
      return mcu8str_create_empty();
    mcu8str res;
    res.owns_memory = 0;
    res.size = 0;
    res.buflen = 0;
#ifdef MC_IS_WINDOWS
    mcwinstr wp = mc_path2longwpath( &p );
    res = mc_winstr_to_u8str(&wp);
    mc_winstr_dealloc(&wp);
#else
    if ( p.size >= 2
         && p.c_str[0] == '~'
         && ( p.c_str[1] == '/' || p.c_str[1] == '\\' ) ) {
      const char * home = getenv("HOME");
      if ( home ) {
        if ( p.size == 2 ) {
          mcu8str rhome = mcu8str_create_from_cstr(home);
          mctools_pathseps_platform(&rhome);
          return rhome;
        }
        const mcu8str_size_t home_size = mctools_strlen( home, 0 );
        const mcu8str_size_t newsize = (mcu8str_size_t)(home_size + p.size - 1);
        if ( ( newsize + 1 != (mcu8str_size_t)(home_size + p.size) )
             || newsize <= home_size || newsize <= p.size )
          mctools_impl_error("string length overflow in mctools_expand_path");
        res = mcu8str_create( newsize );
        mcu8str_append_cstr(&res,home);
        mcu8str_append_cstr(&res, p.c_str + 1 );
      }
    }
    if ( res.size == 0 )
      res = mcu8str_copy( &p );
#endif
    mctools_pathseps_platform(&res);
    return res;
  }